

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool do_fmla(DisasContext_conflict1 *s,arg_rprrr_esz *a,gen_helper_sve_fmla *fn)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  uint32_t uVar2;
  TCGTemp *ts;
  TCGv_i32 pTVar3;
  uintptr_t o;
  
  if (fn != (gen_helper_sve_fmla *)0x0) {
    s_00 = s->uc->tcg_ctx;
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      uVar2 = s->sve_len;
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      uVar2 = simd_desc_aarch64(uVar2,uVar2,
                                (a->ra & 0x1fU) << 0xf |
                                (a->rm & 0x1fU) << 10 | (a->rn & 0x1fU) << 5 | a->rd & 0xfff0001fU);
      pTVar3 = tcg_const_i32_aarch64(s_00,uVar2);
      tcg_gen_addi_i64_aarch64
                (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,
                 (long)(a->pg * 0x20 + 0x2c10));
      (*fn)(s_00,s_00->cpu_env,(TCGv_ptr)((long)ts - (long)s_00),pTVar3);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,ts);
    }
  }
  return fn != (gen_helper_sve_fmla *)0x0;
}

Assistant:

static bool do_fmla(DisasContext *s, arg_rprrr_esz *a, gen_helper_sve_fmla *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (fn == NULL) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned vsz = vec_full_reg_size(s);
    unsigned desc;
    TCGv_i32 t_desc;
    TCGv_ptr pg = tcg_temp_new_ptr(tcg_ctx);

    /* We would need 7 operands to pass these arguments "properly".
     * So we encode all the register numbers into the descriptor.
     */
    desc = deposit32(a->rd, 5, 5, a->rn);
    desc = deposit32(desc, 10, 5, a->rm);
    desc = deposit32(desc, 15, 5, a->ra);
    desc = simd_desc(vsz, vsz, desc);

    t_desc = tcg_const_i32(tcg_ctx, desc);
    tcg_gen_addi_ptr(tcg_ctx, pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    fn(tcg_ctx, tcg_ctx->cpu_env, pg, t_desc);
    tcg_temp_free_i32(tcg_ctx, t_desc);
    tcg_temp_free_ptr(tcg_ctx, pg);
    return true;
}